

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O0

HighsDebugStatus __thiscall HEkk::debugDualSteepestEdgeWeights(HEkk *this,HighsInt alt_debug_level)

{
  double dVar1;
  HighsInt HVar2;
  reference pvVar3;
  int *__b;
  uint *puVar4;
  int in_ESI;
  HEkk *in_RDI;
  HVectorBase<double> *pHVar5;
  char *format;
  double large_relative_dual_steepest_edge_weight_error;
  double relative_dual_steepest_edge_weight_error;
  double error;
  HighsInt iRow_2;
  vector<double,_std::allocator<double>_> updated_dual_edge_weight;
  double true_weight;
  HighsInt iRow_1;
  HighsInt iCheck;
  HVector row_ep;
  HighsInt iRow;
  HighsInt num_check_weight;
  double dual_steepest_edge_weight_error;
  double dual_steepest_edge_weight_norm;
  HighsInt num_row;
  HighsLp *lp;
  HighsInt use_debug_level;
  HVectorBase<double> *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  HighsInt in_stack_fffffffffffffe8c;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe90;
  HVectorBase<double> *this_00;
  int local_13c;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffed0;
  int local_110;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff18;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff5f;
  HEkk *in_stack_ffffffffffffff60;
  int local_4c [5];
  HighsLogOptions *local_38;
  double local_30;
  uint local_24;
  HighsLp *local_20;
  int local_18;
  HighsDebugStatus local_4;
  
  if (in_ESI < 0) {
    in_ESI = (in_RDI->options_->super_HighsOptionsStruct).highs_debug_level;
  }
  if (in_ESI < 2) {
    local_4 = kNotChecked;
  }
  else {
    local_20 = &in_RDI->lp_;
    local_4c[4] = (in_RDI->lp_).num_row_;
    local_30 = 0.0;
    local_38 = (HighsLogOptions *)0x0;
    local_24 = local_4c[4];
    local_18 = in_ESI;
    if (in_ESI < 3) {
      for (local_4c[3] = 0; local_4c[3] < (int)local_24; local_4c[3] = local_4c[3] + 1) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->dual_edge_weight_,(long)local_4c[3]);
        local_30 = ABS(*pvVar3) + local_30;
      }
      local_4c[2] = 1;
      local_4c[1] = 10;
      local_4c[0] = (int)local_24 / 10;
      __b = std::min<int>(local_4c + 1,local_4c);
      puVar4 = (uint *)std::max<int>(local_4c + 2,__b);
      local_4c[4] = *puVar4;
      this_00 = (HVectorBase<double> *)&stack0xffffffffffffff00;
      HVectorBase<double>::HVectorBase(in_stack_fffffffffffffe80);
      HVectorBase<double>::setup(this_00,in_stack_fffffffffffffe8c);
      for (local_110 = 0; local_110 < local_4c[4]; local_110 = local_110 + 1) {
        HVar2 = HighsRandom::integer
                          ((HighsRandom *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                           (HighsInt)((ulong)in_stack_fffffffffffffe80 >> 0x20));
        in_stack_fffffffffffffe8c = HVar2;
        pHVar5 = (HVectorBase<double> *)computeDualSteepestEdgeWeight(in_RDI,in_ESI,this_00);
        in_stack_fffffffffffffe80 = pHVar5;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->dual_edge_weight_,(long)HVar2);
        local_38 = (HighsLogOptions *)(ABS(*pvVar3 - (double)pHVar5) + (double)local_38);
      }
      HVectorBase<double>::~HVectorBase(in_stack_fffffffffffffe80);
    }
    else {
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      computeDualSteepestEdgeWeights(in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f);
      for (local_13c = 0; local_13c < (int)local_24; local_13c = local_13c + 1) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->dual_edge_weight_,(long)local_13c);
        local_30 = ABS(*pvVar3) + local_30;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&stack0xfffffffffffffec8,
                            (long)local_13c);
        dVar1 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->dual_edge_weight_,(long)local_13c);
        local_38 = (HighsLogOptions *)(ABS(dVar1 - *pvVar3) + (double)local_38);
      }
      std::vector<double,_std::allocator<double>_>::operator=
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffe90);
    }
    format = (char *)((double)local_38 / local_30);
    if (in_RDI->debug_max_relative_dual_steepest_edge_weight_error * 10.0 < (double)format) {
      highsLogDev(&(in_RDI->options_->super_HighsOptionsStruct).log_options,kInfo,
                  "Call %2d; Tick %8d: ",(ulong)(uint)in_RDI->debug_solve_call_num_,
                  (ulong)(uint)in_RDI->debug_initial_build_synthetic_tick_);
      highsLogDev(local_38,SUB84(local_30,0),format,
                  &(in_RDI->options_->super_HighsOptionsStruct).log_options,1,
                  "HEkk::debugDualSteepestEdgeWeights   Iteration %5d: Checked %2d weights: error = %10.4g; norm = %10.4g; relative error = %10.4g\n"
                  ,(ulong)(uint)in_RDI->iteration_count_,(ulong)(uint)local_4c[4]);
      fflush(_stdout);
      in_RDI->debug_max_relative_dual_steepest_edge_weight_error = (double)format;
      if (0.001 < (double)format) {
        return kLargeError;
      }
    }
    local_4 = kOk;
  }
  return local_4;
}

Assistant:

HighsDebugStatus HEkk::debugDualSteepestEdgeWeights(
    const HighsInt alt_debug_level) {
  const HighsInt use_debug_level = alt_debug_level >= 0
                                       ? alt_debug_level
                                       : this->options_->highs_debug_level;
  if (use_debug_level < kHighsDebugLevelCostly)
    return HighsDebugStatus::kNotChecked;
  const HighsLp& lp = this->lp_;
  const HighsInt num_row = lp.num_row_;
  double dual_steepest_edge_weight_norm = 0;
  double dual_steepest_edge_weight_error = 0;
  HighsInt num_check_weight;
  if (use_debug_level < kHighsDebugLevelExpensive) {
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      dual_steepest_edge_weight_norm += std::fabs(dual_edge_weight_[iRow]);
    }
    // Just check a few weights
    num_check_weight =
        std::max((HighsInt)1, std::min((HighsInt)10, num_row / 10));
    HVector row_ep;
    row_ep.setup(num_row);
    for (HighsInt iCheck = 0; iCheck < num_check_weight; iCheck++) {
      HighsInt iRow = random_.integer(num_row);
      const double true_weight = computeDualSteepestEdgeWeight(iRow, row_ep);
      dual_steepest_edge_weight_error +=
          std::fabs(this->dual_edge_weight_[iRow] - true_weight);
    }
  } else {
    // Check all weights
    num_check_weight = num_row;
    std::vector<double> updated_dual_edge_weight = this->dual_edge_weight_;
    computeDualSteepestEdgeWeights();
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      dual_steepest_edge_weight_norm +=
          std::fabs(this->dual_edge_weight_[iRow]);
      const double error = std::fabs(updated_dual_edge_weight[iRow] -
                                     this->dual_edge_weight_[iRow]);
      dual_steepest_edge_weight_error += error;
    }
    this->dual_edge_weight_ = updated_dual_edge_weight;
  }
  // Now assess the relative error
  assert(dual_steepest_edge_weight_norm > 0);
  double relative_dual_steepest_edge_weight_error =
      dual_steepest_edge_weight_error / dual_steepest_edge_weight_norm;
  const double large_relative_dual_steepest_edge_weight_error = 1e-3;
  if (relative_dual_steepest_edge_weight_error >
      10 * debug_max_relative_dual_steepest_edge_weight_error) {
    highsLogDev(options_->log_options, HighsLogType::kInfo,
                "Call %2d; Tick %8d: ", (int)debug_solve_call_num_,
                debug_initial_build_synthetic_tick_);
    highsLogDev(
        options_->log_options, HighsLogType::kInfo,
        "HEkk::debugDualSteepestEdgeWeights   Iteration %5d: Checked %2d "
        "weights: "
        "error = %10.4g; norm = %10.4g; relative error = %10.4g\n",
        (int)iteration_count_, (int)num_check_weight,
        dual_steepest_edge_weight_error, dual_steepest_edge_weight_norm,
        relative_dual_steepest_edge_weight_error);
    fflush(stdout);
    debug_max_relative_dual_steepest_edge_weight_error =
        relative_dual_steepest_edge_weight_error;
    if (relative_dual_steepest_edge_weight_error >
        large_relative_dual_steepest_edge_weight_error)
      return HighsDebugStatus::kLargeError;
  }
  return HighsDebugStatus::kOk;
}